

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O2

void __thiscall
Args::CmdLine::savePositionalArguments(CmdLine *this,String *word,bool splitted,bool valuePrepended)

{
  pointer pbVar1;
  value_type *__x;
  bool bVar2;
  undefined7 in_register_00000011;
  String tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&tmp,(string *)word);
  if ((int)CONCAT71(in_register_00000011,splitted) != 0) {
    std::__cxx11::string::append((ulong)&tmp,'\x01');
    if (valuePrepended) {
      pbVar1 = (this->m_context).m_it._M_current;
      if (pbVar1 != (this->m_context).m_context.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        (this->m_context).m_it._M_current = pbVar1 + 1;
      }
      std::__cxx11::string::append((string *)&tmp);
    }
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_38,'\x02');
  bVar2 = std::operator!=(&tmp,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_positional,&tmp);
  }
  while (__x = (this->m_context).m_it._M_current,
        __x != (this->m_context).m_context.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
    (this->m_context).m_it._M_current = __x + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_positional,__x);
  }
  std::__cxx11::string::~string((string *)&tmp);
  return;
}

Assistant:

void savePositionalArguments( const String & word, bool splitted, bool valuePrepended )
	{
		auto tmp = word;

		if( splitted )
		{
			tmp.append( 1, '=' );

			if( valuePrepended )
				tmp.append( *m_context.next() );
		}

		if( tmp != String( 2, '-' ) )
			m_positional.push_back( tmp );

		while( !m_context.atEnd() )
		{
			auto it = m_context.next();

			m_positional.push_back( *it );
		}
	}